

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksLoader.cpp
# Opt level: O2

Expected<Talks> * __thiscall
cppti::TalksLoader::loadFrom
          (Expected<Talks> *__return_storage_ptr__,TalksLoader *this,string_view file)

{
  allocator<char> local_281;
  undefined1 local_280 [40];
  undefined1 local_258 [40];
  string_view file_local;
  ifstream ifs;
  byte abStack_200 [488];
  
  file_local._M_str = (char *)file._M_len;
  file_local._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_280,&file_local,(allocator<char> *)local_258);
  std::ifstream::ifstream(&ifs,(string *)local_280,_S_in);
  std::__cxx11::string::~string((string *)local_280);
  if ((abStack_200[*(long *)(_ifs + -0x18)] & 5) == 0) {
    loadFrom(__return_storage_ptr__,(istream *)&ifs);
  }
  else {
    local_258._0_4_ = DB_FAILED_TO_OPEN;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_258 + 8),"Failed to open database.",&local_281);
    ErrContext::ErrContext((ErrContext *)local_280,(ErrContext *)local_258);
    tl::expected<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>::
    expected<cppti::ErrContext,_nullptr,_nullptr>
              (__return_storage_ptr__,(unexpected<cppti::ErrContext> *)local_280);
    std::__cxx11::string::~string((string *)(local_280 + 8));
    std::__cxx11::string::~string((string *)(local_258 + 8));
  }
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

Expected<Talks> TalksLoader::loadFrom(std::string_view file)
{
  auto ifs = std::ifstream{std::string{file}};
  if (!ifs)
    return tl::unexpected{
        ErrContext{ErrCode::DB_FAILED_TO_OPEN, "Failed to open database."}};
  return loadFrom(ifs);
}